

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrinkles.cpp
# Opt level: O2

void __thiscall Wrinkles::apply(Wrinkles *this,Vector *p,SurfaceData *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  bool bVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double local_a0;
  Vector local_88;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  Vector local_48;
  
  if ((this->amount == 0.0) && (!NAN(this->amount))) {
    return;
  }
  local_a0 = 0.0;
  dVar8 = 0.0;
  dVar9 = 0.0;
  dVar6 = 1.0;
  iVar4 = 10;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_48.z = p->z * dVar6;
    local_48.x = p->x * dVar6;
    local_48.y = p->y * dVar6;
    local_68 = dVar6;
    dStack_60 = dVar6;
    local_58 = dVar8;
    dStack_50 = dVar9;
    noise_3d(&local_88,&local_48);
    auVar2._8_8_ = local_88.y;
    auVar2._0_8_ = local_88.x;
    auVar3._8_8_ = dStack_60;
    auVar3._0_8_ = local_68;
    auVar7 = divpd(auVar2,auVar3);
    dVar8 = local_58 + ABS(auVar7._0_8_);
    dVar9 = dStack_50 + ABS(auVar7._8_8_);
    local_a0 = local_a0 + ABS(local_88.z / dVar6);
    dVar6 = dVar6 + dVar6;
  }
  local_88.y = this->amount;
  local_88.z = local_a0 * local_88.y;
  local_88.x = dVar8 * local_88.y;
  local_88.y = dVar9 * local_88.y;
  Vector::operator+=(&t->n,&local_88);
  dVar6 = (t->n).z;
  auVar7._0_8_ = (t->n).x;
  auVar7._8_8_ = (t->n).y;
  dVar8 = SQRT(dVar6 * dVar6 +
               (double)auVar7._0_8_ * (double)auVar7._0_8_ +
               (double)auVar7._8_8_ * (double)auVar7._8_8_);
  auVar1._8_8_ = dVar8;
  auVar1._0_8_ = dVar8;
  auVar7 = divpd(auVar7,auVar1);
  (t->n).x = (double)auVar7._0_8_;
  (t->n).y = (double)auVar7._8_8_;
  (t->n).z = dVar6 / dVar8;
  return;
}

Assistant:

void Wrinkles::apply( Vector& p, Grayzer::SurfaceData& t )
{
   Vector result (0.0);
   Vector value;
   double scale = 1.0;
   int   i;

   if(   amount == 0.0 )   return;

   for( i = 0; i <   10;   scale *= 2.0, i++ )
   {
      value =  noise_3d( p * scale  );
      result.x += fabs(value.x / scale);
      result.y += fabs(value.y / scale);
      result.z += fabs(value.z / scale);
   }
   t.n   += result * amount;
   t.n   = normalize( t.n );
}